

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  uint8_t *puVar1;
  ptls_buffer_t *ppVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  
  if ((tls->field_0x160 & 4) == 0) {
    return 0;
  }
  if (emitter->begin_message != begin_record_message) {
    return 10;
  }
  ppVar2 = emitter->buf;
  iVar5 = ptls_buffer_reserve(ppVar2,3);
  if (iVar5 == 0) {
    puVar3 = ppVar2->base;
    sVar8 = ppVar2->off;
    puVar1 = puVar3 + sVar8;
    puVar1[0] = '\x14';
    puVar1[1] = '\x03';
    puVar3[sVar8 + 2] = '\x03';
    ppVar2->off = ppVar2->off + 3;
    iVar5 = 0;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  ppVar2 = emitter->buf;
  iVar5 = ptls_buffer_reserve(ppVar2,2);
  if (iVar5 == 0) {
    puVar1 = ppVar2->base;
    sVar8 = ppVar2->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    ppVar2->off = ppVar2->off + 2;
    iVar5 = 0;
  }
  if (iVar5 == 0) {
    ppVar2 = emitter->buf;
    sVar8 = ppVar2->off;
    iVar5 = ptls_buffer_reserve(ppVar2,1);
    if (iVar5 == 0) {
      ppVar2->base[ppVar2->off] = '\x01';
      ppVar2->off = ppVar2->off + 1;
      iVar5 = 0;
    }
    if (iVar5 == 0) {
      uVar6 = emitter->buf->off - sVar8;
      lVar7 = 8;
      do {
        emitter->buf->base[sVar8 - 2] = (uint8_t)(uVar6 >> ((byte)lVar7 & 0x3f));
        lVar7 = lVar7 + -8;
        sVar8 = sVar8 + 1;
      } while (lVar7 != -8);
      bVar4 = true;
      iVar5 = 0;
      goto LAB_00111af3;
    }
  }
  bVar4 = false;
LAB_00111af3:
  if (bVar4) {
    tls->field_0x160 = tls->field_0x160 & 0xfb;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}